

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExpandedCommandArgument.cxx
# Opt level: O2

void __thiscall
cmExpandedCommandArgument::cmExpandedCommandArgument
          (cmExpandedCommandArgument *this,string *value,bool quoted)

{
  std::__cxx11::string::string((string *)this,(string *)value);
  this->Quoted = quoted;
  return;
}

Assistant:

cmExpandedCommandArgument::cmExpandedCommandArgument(
  std::string const& value, bool quoted):
    Value(value), Quoted(quoted)
{

}